

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wield.c
# Opt level: O2

void drop_uswapwep(void)

{
  obj *otmp;
  char *pcVar1;
  char str [256];
  
  otmp = uswapwep;
  pcVar1 = body_part(6);
  pcVar1 = makeplural(pcVar1);
  strcpy(str,pcVar1);
  pcVar1 = aobjnam(otmp,"slip");
  pline("Your %s from your %s!",pcVar1,str);
  dropx(otmp);
  return;
}

Assistant:

void drop_uswapwep(void)
{
	char str[BUFSZ];
	struct obj *obj = uswapwep;

	/* Avoid trashing makeplural's static buffer */
	strcpy(str, makeplural(body_part(HAND)));
	pline("Your %s from your %s!",  aobjnam(obj, "slip"), str);
	dropx(obj);
}